

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O1

void __thiscall lts2::LBDOperator::drawSelfInImage(LBDOperator *this,Mat *destImage,int normalize)

{
  _InputArray *p_Var1;
  uint idx;
  Mat currentBasisVector;
  _InputArray local_230;
  _OutputArray local_218;
  int local_200;
  int local_1fc;
  long *local_1f8;
  _InputArray *p_Stack_1f0;
  Size local_1e8;
  undefined8 uStack_1e0;
  Mat local_188 [96];
  Mat local_128 [152];
  _InputArray local_90 [4];
  
  local_200 = (this->_patchSize).width;
  local_1fc = (this->_patchSize).height;
  cv::Mat::create(destImage,&local_200,5);
  local_90[0].obj = &local_1f8;
  local_1e8.width = 0;
  local_1e8.height = 0;
  uStack_1e0 = 0;
  local_1f8 = (long *)0x0;
  p_Stack_1f0 = (_InputArray *)0x0;
  local_90[0].flags = -0x3efdfffa;
  local_90[0].sz.width = 1;
  local_90[0].sz.height = 4;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)destImage,local_90);
  cv::Mat::Mat((Mat *)local_90);
  if (*(int *)&(this->super_LinearOperator).field_0xc != 0) {
    idx = 0;
    do {
      fillBasisFunctionForIndex(this,(Mat *)local_90,idx);
      cv::abs((Mat *)&local_1f8);
      (**(code **)(*local_1f8 + 0x18))(local_1f8,(_InputArray *)&local_1f8,local_90,0xffffffff);
      cv::Mat::~Mat(local_128);
      cv::Mat::~Mat(local_188);
      cv::Mat::~Mat((Mat *)&local_1e8);
      if (0 < normalize) {
        local_1e8.width = 0;
        local_1e8.height = 0;
        local_1f8 = (long *)CONCAT44(local_1f8._4_4_,0x1010000);
        local_230.sz.width = 0;
        local_230.sz.height = 0;
        local_230.flags = 0x2010000;
        local_230.obj = local_90;
        p_Stack_1f0 = local_90;
        cv::threshold((_InputArray *)&local_1f8,(_OutputArray *)&local_230,0.0,1.0,0);
      }
      if (normalize < 0) {
        local_1e8.width = 0;
        local_1e8.height = 0;
        local_1f8 = (long *)CONCAT44(local_1f8._4_4_,0x1010000);
        local_230.sz.width = 0;
        local_230.sz.height = 0;
        local_230.flags = 0x3010000;
        local_230.obj = local_90;
        p_Stack_1f0 = local_90;
        p_Var1 = (_InputArray *)cv::noArray();
        cv::normalize((_InputArray *)&local_1f8,(_InputOutputArray *)&local_230,0.0,1.0,0x20,-1,
                      p_Var1);
      }
      local_1e8.width = 0;
      local_1e8.height = 0;
      local_1f8 = (long *)CONCAT44(local_1f8._4_4_,0x1010000);
      local_230.sz.width = 0;
      local_230.sz.height = 0;
      local_230.flags = 0x1010000;
      local_218.super__InputArray.sz.width = 0;
      local_218.super__InputArray.sz.height = 0;
      local_218.super__InputArray.flags = -0x3dff0000;
      local_230.obj = local_90;
      local_218.super__InputArray.obj = destImage;
      p_Stack_1f0 = (_InputArray *)destImage;
      p_Var1 = (_InputArray *)cv::noArray();
      cv::add((_InputArray *)&local_1f8,&local_230,&local_218,p_Var1,-1);
      idx = idx + 1;
    } while (idx < *(uint *)&(this->super_LinearOperator).field_0xc);
  }
  cv::Mat::~Mat((Mat *)local_90);
  return;
}

Assistant:

void lts2::LBDOperator::drawSelfInImage(cv::Mat &destImage, int normalize) const
{
  destImage.create(_patchSize, CV_32FC1);
  destImage.setTo(cv::Scalar(0));

  cv::Mat currentBasisVector;
  for (int i = 0; i < _pairsInUse; ++i)
  {
    this->fillBasisFunctionForIndex(currentBasisVector, i);
    currentBasisVector = cv::abs(currentBasisVector);

    if (normalize > 0) cv::threshold(currentBasisVector, currentBasisVector, 0.0, 1.0, cv::THRESH_BINARY);
    if (normalize < 0) cv::normalize(currentBasisVector, currentBasisVector, 0.0, 1.0, cv::NORM_MINMAX);

    destImage += currentBasisVector;
  }
}